

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

TCGType_conflict
choose_vector_type(TCGContext_conflict9 *tcg_ctx,TCGOpcode *list,uint vece,uint32_t size,
                  _Bool prefer_i64)

{
  _Bool _Var1;
  _Bool prefer_i64_local;
  uint32_t size_local;
  uint vece_local;
  TCGOpcode *list_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  if ((((have_avx2_tricore) && (_Var1 = check_size_impl(size,0x20), _Var1)) &&
      (_Var1 = tcg_can_emit_vecop_list_tricore(tcg_ctx,list,TCG_TYPE_V256,vece), _Var1)) &&
     (((size & 0x1f) == 0 ||
      (_Var1 = tcg_can_emit_vecop_list_tricore(tcg_ctx,list,TCG_TYPE_V128,vece), _Var1)))) {
    tcg_ctx_local._4_4_ = TCG_TYPE_V256;
  }
  else if ((((have_avx1_tricore & 1U) == 0) || (_Var1 = check_size_impl(size,0x10), !_Var1)) ||
          (_Var1 = tcg_can_emit_vecop_list_tricore(tcg_ctx,list,TCG_TYPE_V128,vece), !_Var1)) {
    if (((((have_avx1_tricore & 1U) == 0) || (prefer_i64)) ||
        (_Var1 = check_size_impl(size,8), !_Var1)) ||
       (_Var1 = tcg_can_emit_vecop_list_tricore(tcg_ctx,list,TCG_TYPE_V64,vece), !_Var1)) {
      tcg_ctx_local._4_4_ = TCG_TYPE_I32;
    }
    else {
      tcg_ctx_local._4_4_ = TCG_TYPE_V64;
    }
  }
  else {
    tcg_ctx_local._4_4_ = TCG_TYPE_V128;
  }
  return tcg_ctx_local._4_4_;
}

Assistant:

static TCGType choose_vector_type(TCGContext *tcg_ctx, const TCGOpcode *list, unsigned vece,
                                  uint32_t size, bool prefer_i64)
{
    if (TCG_TARGET_HAS_v256 && check_size_impl(size, 32)) {
        /*
         * Recall that ARM SVE allows vector sizes that are not a
         * power of 2, but always a multiple of 16.  The intent is
         * that e.g. size == 80 would be expanded with 2x32 + 1x16.
         * It is hard to imagine a case in which v256 is supported
         * but v128 is not, but check anyway.
         */
        if (tcg_can_emit_vecop_list(tcg_ctx, list, TCG_TYPE_V256, vece)
            && (size % 32 == 0
                || tcg_can_emit_vecop_list(tcg_ctx, list, TCG_TYPE_V128, vece))) {
            return TCG_TYPE_V256;
        }
    }
    if (TCG_TARGET_HAS_v128 && check_size_impl(size, 16)
        && tcg_can_emit_vecop_list(tcg_ctx, list, TCG_TYPE_V128, vece)) {
        return TCG_TYPE_V128;
    }
    if (TCG_TARGET_HAS_v64 && !prefer_i64 && check_size_impl(size, 8)
        && tcg_can_emit_vecop_list(tcg_ctx, list, TCG_TYPE_V64, vece)) {
        return TCG_TYPE_V64;
    }
    return 0;
}